

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O1

void WriteBinaryDump(aiScene *scene,FILE *_out,char *src,char *cmd,bool _shortened,bool compressed,
                    ImportData *param_7)

{
  FILE *__stream;
  tm *__tp;
  char *pcVar1;
  long lVar2;
  uint32_t t;
  tm now;
  time_t local_170;
  uint local_168 [30];
  ulong uStack_f0;
  undefined1 local_69;
  tm local_68;
  
  out = _out;
  shortened = _shortened;
  local_170 = time((time_t *)0x0);
  __tp = gmtime_r(&local_170,&local_68);
  __stream = out;
  if (__tp == (tm *)0x0) {
    __assert_fail("nullptr != p",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/tools/assimp_cmd/WriteDumb.cpp"
                  ,0x2b3,
                  "void WriteBinaryDump(const aiScene *, FILE *, const char *, const char *, bool, bool, ImportData &)"
                 );
  }
  pcVar1 = asctime(__tp);
  fprintf((FILE *)__stream,"ASSIMP.binary-dump.%s",pcVar1);
  local_168[0] = 1;
  fwrite(local_168,4,1,(FILE *)out);
  local_168[0] = 0;
  fwrite(local_168,4,1,(FILE *)out);
  local_168[0] = aiGetVersionRevision();
  fwrite(local_168,4,1,(FILE *)out);
  local_168[0] = aiGetCompileFlags();
  fwrite(local_168,4,1,(FILE *)out);
  local_168[0]._0_2_ = (ushort)shortened;
  fwrite(local_168,2,1,(FILE *)out);
  local_168[0]._0_2_ = (ushort)compressed;
  fwrite(local_168,2,1,(FILE *)out);
  memset(local_168,0,0x100);
  strncpy((char *)local_168,src,0x100);
  local_69 = 0;
  fwrite(local_168,0x100,1,(FILE *)out);
  local_168[0x1c] = 0;
  local_168[0x1d] = 0;
  uStack_f0 = 0;
  local_168[0x18] = 0;
  local_168[0x19] = 0;
  local_168[0x1a] = 0;
  local_168[0x1b] = 0;
  local_168[0x14] = 0;
  local_168[0x15] = 0;
  local_168[0x16] = 0;
  local_168[0x17] = 0;
  local_168[0x10] = 0;
  local_168[0x11] = 0;
  local_168[0x12] = 0;
  local_168[0x13] = 0;
  local_168[0xc] = 0;
  local_168[0xd] = 0;
  local_168[0xe] = 0;
  local_168[0xf] = 0;
  local_168[8] = 0;
  local_168[9] = 0;
  local_168[10] = 0;
  local_168[0xb] = 0;
  local_168[4] = 0;
  local_168[5] = 0;
  local_168[6] = 0;
  local_168[7] = 0;
  local_168[0] = 0;
  local_168[1] = 0;
  local_168[2] = 0;
  local_168[3] = 0;
  strncpy((char *)local_168,cmd,0x80);
  uStack_f0 = uStack_f0 & 0xffffffffffffff;
  fwrite(local_168,0x80,1,(FILE *)out);
  local_168[0xc] = 0xcdcdcdcd;
  local_168[0xd] = 0xcdcdcdcd;
  local_168[0xe] = 0xcdcdcdcd;
  local_168[0xf] = 0xcdcdcdcd;
  local_168[8] = 0xcdcdcdcd;
  local_168[9] = 0xcdcdcdcd;
  local_168[10] = 0xcdcdcdcd;
  local_168[0xb] = 0xcdcdcdcd;
  local_168[4] = 0xcdcdcdcd;
  local_168[5] = 0xcdcdcdcd;
  local_168[6] = 0xcdcdcdcd;
  local_168[7] = 0xcdcdcdcd;
  local_168[0] = 0xcdcdcdcd;
  local_168[1] = 0xcdcdcdcd;
  local_168[2] = 0xcdcdcdcd;
  local_168[3] = 0xcdcdcdcd;
  fwrite(local_168,0x40,1,(FILE *)out);
  lVar2 = ftell((FILE *)out);
  if (lVar2 == 0x200) {
    WriteBinaryScene(scene);
    return;
  }
  __assert_fail("ftell(out)==512",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/tools/assimp_cmd/WriteDumb.cpp"
                ,0x2d8,
                "void WriteBinaryDump(const aiScene *, FILE *, const char *, const char *, bool, bool, ImportData &)"
               );
}

Assistant:

void WriteBinaryDump(const aiScene* scene, FILE* _out, const char* src, const char* cmd, 
	bool _shortened, bool compressed, ImportData& /*imp*/)
{
	out = _out;
	shortened = _shortened;

	time_t tt = time(NULL);
#if _WIN32
    tm* p = gmtime(&tt);
#else
    struct tm now;
    tm* p = gmtime_r(&tt, &now);
#endif
    ai_assert(nullptr != p);

	// header
	fprintf(out,"ASSIMP.binary-dump.%s",asctime(p));
	// == 44 bytes

	Write<unsigned int>(ASSBIN_VERSION_MAJOR);
	Write<unsigned int>(ASSBIN_VERSION_MINOR);
	Write<unsigned int>(aiGetVersionRevision());
	Write<unsigned int>(aiGetCompileFlags());
	Write<uint16_t>(shortened);
	Write<uint16_t>(compressed);
	// ==  20 bytes

	{
		char buff[256] = { 0 };
		strncpy(buff,src,256);
		buff[255] = 0;
		fwrite(buff,256,1,out);
	}

	{
		char buff[128] = { 0 };
		strncpy(buff,cmd,128);
		buff[127] = 0;
		fwrite(buff,128,1,out);
	}

	// leave 64 bytes free for future extensions
	{
		char buff[64];
		memset(buff,0xcd,64);
		fwrite(buff,64,1,out);
	}
	// == 435 bytes

	// ==== total header size: 512 bytes
	ai_assert(ftell(out)==ASSBIN_HEADER_LENGTH);

	// Up to here the data is uncompressed. For compressed files, the rest
	// is compressed using standard DEFLATE from zlib.
	WriteBinaryScene(scene);
}